

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::ArenaTest_SpaceReuseForArraysSizeChecks_Test::TestBody
          (ArenaTest_SpaceReuseForArraysSizeChecks_Test *this)

{
  bool bVar1;
  __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_> _Var2;
  char *message;
  size_t n;
  int iVar3;
  void **ppvVar4;
  long in_FS_OFFSET;
  ScopedTrace gtest_trace_1817;
  AssertionResult gtest_ar;
  vector<void_*,_std::allocator<void_*>_> pointers;
  vector<void_*,_std::allocator<void_*>_> second_pointers;
  Arena arena;
  ScopedTrace local_181;
  int local_180;
  allocator_type local_17a;
  allocator_type local_179;
  char local_178 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_170;
  void **local_168;
  __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_> _Stack_160;
  long local_158;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_150;
  void *local_148;
  undefined8 uStack_140;
  long local_138;
  __normal_iterator<void_*const_*,_std::vector<void_*,_std::allocator<void_*>_>_> local_130;
  __normal_iterator<void_*const_*,_std::vector<void_*,_std::allocator<void_*>_>_> local_128;
  long local_120;
  void *local_118;
  undefined8 uStack_110;
  long local_108;
  undefined4 local_f8;
  void *local_f0;
  undefined8 uStack_e8;
  long local_e0;
  ThreadSafeArena local_d8;
  
  local_180 = 0;
  while( true ) {
    testing::ScopedTrace::ScopedTrace<int>
              (&local_181,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x719,&local_180);
    protobuf::internal::ThreadSafeArena::ThreadSafeArena(&local_d8);
    local_168 = (void **)0x0;
    _Stack_160._M_current = (void **)0x0;
    local_158 = 0;
    n = (size_t)(0x10 << ((byte)local_180 & 0x1f));
    iVar3 = 10;
    do {
      local_150._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           Arena::AllocateForArray((Arena *)&local_d8,n);
      std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                ((vector<void*,std::allocator<void*>> *)&local_168,&local_150._M_head_impl);
      _Var2._M_current = _Stack_160._M_current;
      iVar3 = iVar3 + -1;
      ppvVar4 = local_168;
    } while (iVar3 != 0);
    for (; ppvVar4 != _Var2._M_current; ppvVar4 = ppvVar4 + 1) {
      if (*(uint64_t *)(in_FS_OFFSET + -0x78) == local_d8.tag_and_id_) {
        protobuf::internal::SerialArena::ReturnArrayMemory
                  (*(SerialArena **)(in_FS_OFFSET + -0x70),*ppvVar4,n);
      }
    }
    local_118 = (void *)0x0;
    uStack_110 = 0;
    local_108 = 0;
    iVar3 = -9;
    do {
      local_150._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           Arena::AllocateForArray((Arena *)&local_d8,n);
      std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                ((vector<void*,std::allocator<void*>> *)&local_118,&local_150._M_head_impl);
      iVar3 = iVar3 + 1;
    } while (iVar3 != 0);
    std::vector<void*,std::allocator<void*>>::
    vector<__gnu_cxx::__normal_iterator<void**,std::vector<void*,std::allocator<void*>>>,void>
              ((vector<void*,std::allocator<void*>> *)&local_130,
               (__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>)
               (local_168 + 1),_Stack_160,&local_17a);
    local_f8 = 3;
    std::vector<void*,std::allocator<void*>>::
    vector<__gnu_cxx::__normal_iterator<void*const*,std::vector<void*,std::allocator<void*>>>,void>
              ((vector<void*,std::allocator<void*>> *)&local_f0,local_130,local_128,&local_179);
    local_138 = local_e0;
    uStack_140 = uStack_e8;
    local_148 = local_f0;
    local_f0 = (void *)0x0;
    uStack_e8 = 0;
    local_e0 = 0;
    local_150._M_head_impl._0_4_ = local_f8;
    testing::internal::
    PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<void*>>::
    operator()(local_178,(char *)&local_150,
               (vector<void_*,_std::allocator<void_*>_> *)"second_pointers");
    if (local_148 != (void *)0x0) {
      operator_delete(local_148,local_138 - (long)local_148);
    }
    if (local_f0 != (void *)0x0) {
      operator_delete(local_f0,local_e0 - (long)local_f0);
    }
    if (local_130._M_current != (void **)0x0) {
      operator_delete(local_130._M_current,local_120 - (long)local_130._M_current);
    }
    if (local_178[0] == '\0') break;
    if (local_170 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_170,local_170);
    }
    if (local_118 != (void *)0x0) {
      operator_delete(local_118,local_108 - (long)local_118);
    }
    if (local_168 != (void **)0x0) {
      operator_delete(local_168,local_158 - (long)local_168);
    }
    protobuf::internal::ThreadSafeArena::~ThreadSafeArena(&local_d8);
    testing::ScopedTrace::~ScopedTrace(&local_181);
    bVar1 = 0x12 < local_180;
    local_180 = local_180 + 1;
    if (bVar1) {
      return;
    }
  }
  testing::Message::Message((Message *)&local_150);
  if (local_170 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    message = anon_var_dwarf_a12c75 + 5;
  }
  else {
    message = (local_170->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_130,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
             ,0x730,message);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_130,(Message *)&local_150);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_130);
  if (local_150._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_150._M_head_impl + 8))();
  }
  if (local_170 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_170,local_170);
  }
  if (local_118 != (void *)0x0) {
    operator_delete(local_118,local_108 - (long)local_118);
  }
  if (local_168 != (void **)0x0) {
    operator_delete(local_168,local_158 - (long)local_168);
  }
  protobuf::internal::ThreadSafeArena::~ThreadSafeArena(&local_d8);
  testing::ScopedTrace::~ScopedTrace(&local_181);
  return;
}

Assistant:

TEST(ArenaTest, SpaceReuseForArraysSizeChecks) {
  // Limit to 1<<20 to avoid using too much memory on the test.
  for (int i = 0; i < 20; ++i) {
    SCOPED_TRACE(i);
    Arena arena;
    std::vector<void*> pointers;

    const size_t size = 16 << i;

    for (int j = 0; j < 10; ++j) {
      pointers.push_back(Arena::CreateArray<char>(&arena, size));
    }

    for (void* p : pointers) {
      internal::ArenaTestPeer::ReturnArrayMemory(&arena, p, size);
    }

    std::vector<void*> second_pointers;
    for (int j = 9; j != 0; --j) {
      second_pointers.push_back(Arena::CreateArray<char>(&arena, size));
    }

    // The arena will give us back the pointers we returned, except the first
    // one. That one becomes part of the freelist data structure.
    ASSERT_THAT(second_pointers,
                testing::UnorderedElementsAreArray(
                    std::vector<void*>(pointers.begin() + 1, pointers.end())));
  }
}